

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O2

void duckdb::ArrowConverter::ToArrowSchema
               (ArrowSchema *out_schema,vector<duckdb::LogicalType,_true> *types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,ClientProperties *options)

{
  templated_unique_single_t tVar1;
  unsigned_long __new_size;
  pointer pDVar2;
  reference pvVar3;
  reference ppAVar4;
  long lVar5;
  const_reference pvVar6;
  type pDVar7;
  const_reference type;
  ClientContext *context;
  size_t i;
  size_type __n;
  size_type __n_00;
  templated_unique_single_t root_holder;
  value_type local_50;
  optional_ptr<duckdb::ClientContext,_true> *local_48;
  vector<duckdb::LogicalType,_true> *local_40;
  unsigned_long local_38;
  
  __new_size = ((long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                     ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_40 = types;
  make_uniq<duckdb::DuckDBArrowSchemaHolder>();
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->(&root_holder);
  ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
            ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)pDVar2,__new_size);
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->(&root_holder);
  local_50 = (value_type)0x0;
  ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
            (&(pDVar2->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>,
             __new_size,&local_50);
  for (__n = 0; __new_size != __n; __n = __n + 1) {
    pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator->(&root_holder);
    pvVar3 = vector<ArrowSchema,_true>::get<true>(&pDVar2->children,__n);
    pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator->(&root_holder);
    ppAVar4 = vector<ArrowSchema_*,_true>::get<true>(&pDVar2->children_ptrs,__n);
    *ppAVar4 = pvVar3;
  }
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->(&root_holder);
  out_schema->children =
       (pDVar2->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
       super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__new_size);
  out_schema->n_children = lVar5;
  out_schema->format = "+s";
  out_schema->metadata = (char *)0x0;
  out_schema->flags = 0;
  out_schema->name = "duckdb_query_result";
  out_schema->dictionary = (ArrowSchema *)0x0;
  local_48 = &options->client_context;
  local_38 = __new_size;
  for (__n_00 = 0;
      tVar1.
      super_unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
      .super__Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false>._M_head_impl =
           root_holder.
           super_unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
           .super__Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false>._M_head_impl,
      local_38 != __n_00; __n_00 = __n_00 + 1) {
    pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator->(&root_holder);
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(names,__n_00);
    AddName((duckdb *)&local_50,pvVar6);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&pDVar2->owned_column_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_50);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_50);
    pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator->(&root_holder);
    pvVar3 = vector<ArrowSchema,_true>::get<true>(&pDVar2->children,__n_00);
    pDVar7 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator*(&root_holder);
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(names,__n_00);
    InitializeChild(pvVar3,pDVar7,pvVar6);
    pDVar7 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
             ::operator*(&root_holder);
    type = vector<duckdb::LogicalType,_true>::get<true>(local_40,__n_00);
    context = optional_ptr<duckdb::ClientContext,_true>::operator*(local_48);
    SetArrowFormat(pDVar7,pvVar3,type,options,context);
  }
  root_holder.
  super_unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
  .super__Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
        )(__uniq_ptr_data<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true,_true>
          )0x0;
  out_schema->private_data =
       (void *)tVar1.
               super_unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
               .super__Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false>._M_head_impl;
  out_schema->release = ReleaseDuckDBArrowSchema;
  ::std::
  unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
  ::~unique_ptr(&root_holder.
                 super_unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>_>
               );
  return;
}

Assistant:

void ArrowConverter::ToArrowSchema(ArrowSchema *out_schema, const vector<LogicalType> &types,
                                   const vector<string> &names, ClientProperties &options) {
	D_ASSERT(out_schema);
	D_ASSERT(types.size() == names.size());
	const idx_t column_count = types.size();
	// Allocate as unique_ptr first to clean-up properly on error
	auto root_holder = make_uniq<DuckDBArrowSchemaHolder>();

	// Allocate the children
	root_holder->children.resize(column_count);
	root_holder->children_ptrs.resize(column_count, nullptr);
	for (size_t i = 0; i < column_count; ++i) {
		root_holder->children_ptrs[i] = &root_holder->children[i];
	}
	out_schema->children = root_holder->children_ptrs.data();
	out_schema->n_children = NumericCast<int64_t>(column_count);

	// Store the schema
	out_schema->format = "+s"; // struct apparently
	out_schema->flags = 0;
	out_schema->metadata = nullptr;
	out_schema->name = "duckdb_query_result";
	out_schema->dictionary = nullptr;

	// Configure all child schemas
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		root_holder->owned_column_names.push_back(AddName(names[col_idx]));
		auto &child = root_holder->children[col_idx];
		InitializeChild(child, *root_holder, names[col_idx]);
		SetArrowFormat(*root_holder, child, types[col_idx], options, *options.client_context);
	}

	// Release ownership to caller
	out_schema->private_data = root_holder.release();
	out_schema->release = ReleaseDuckDBArrowSchema;
}